

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_pkcs1_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uchar *output;
  uchar *output_00;
  
  iVar1 = -0x4080;
  if ((hashlen == 0 && md_alg == MBEDTLS_MD_NONE || hash != (uchar *)0x0) &&
     (iVar1 = -0x4100, ctx->padding == 0)) {
    iVar1 = -0x4080;
    if ((hashlen == 0 && md_alg == MBEDTLS_MD_NONE || hash != (uchar *)0x0) &&
       ((ctx->padding == 0 &&
        (iVar1 = rsa_rsassa_pkcs1_v15_encode(md_alg,hashlen,hash,ctx->len,sig), iVar1 == 0)))) {
      __size = ctx->len;
      output = (uchar *)calloc(1,__size);
      iVar1 = -0x10;
      if (output != (uchar *)0x0) {
        output_00 = (uchar *)calloc(1,__size);
        if (output_00 == (uchar *)0x0) {
          free(output);
        }
        else {
          iVar1 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,output);
          if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_public(ctx,output,output_00), iVar1 == 0)) {
            iVar2 = mbedtls_ct_memcmp(output_00,sig,ctx->len);
            iVar1 = -0x4300;
            if (iVar2 == 0) {
              switchD_016b0717::default(sig,output,ctx->len);
              iVar1 = 0;
            }
          }
          mbedtls_zeroize_and_free(output,ctx->len);
          mbedtls_zeroize_and_free(output_00,ctx->len);
          if (iVar1 == 0) {
            iVar1 = 0;
          }
          else {
            switchD_016d4fed::default(sig,0x21,ctx->len);
          }
        }
      }
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_pkcs1_sign(mbedtls_rsa_context *ctx,
                           int (*f_rng)(void *, unsigned char *, size_t),
                           void *p_rng,
                           mbedtls_md_type_t md_alg,
                           unsigned int hashlen,
                           const unsigned char *hash,
                           unsigned char *sig)
{
    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    switch (ctx->padding) {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_sign(ctx, f_rng, p_rng,
                                                     md_alg, hashlen, hash, sig);
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_sign(ctx, f_rng, p_rng, md_alg,
                                               hashlen, hash, sig);
#endif

        default:
            return MBEDTLS_ERR_RSA_INVALID_PADDING;
    }
}